

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Ses_StoreWrite(Ses_Store_t *pStore,char *pFilename,int fSynthImp,int fSynthRL,int fUnsynthImp,
                   int fUnsynthRL)

{
  FILE *__s;
  FILE *pFile;
  Ses_TimesEntry_t *pTiEntry;
  Ses_TruthEntry_t *pTEntry;
  unsigned_long nEntries;
  int iStack_28;
  char zero;
  int i;
  int fUnsynthRL_local;
  int fUnsynthImp_local;
  int fSynthRL_local;
  int fSynthImp_local;
  char *pFilename_local;
  Ses_Store_t *pStore_local;
  
  nEntries._3_1_ = 0;
  pTEntry = (Ses_TruthEntry_t *)0x0;
  iStack_28 = fUnsynthRL;
  i = fUnsynthImp;
  fUnsynthRL_local = fSynthRL;
  fUnsynthImp_local = fSynthImp;
  _fSynthRL_local = pFilename;
  pFilename_local = (char *)pStore;
  __s = fopen(pFilename,"wb");
  if (__s == (FILE *)0x0) {
    printf("cannot open file \"%s\" for writing\n",_fSynthRL_local);
  }
  else {
    if (fUnsynthImp_local != 0) {
      pTEntry = (Ses_TruthEntry_t *)((long)pTEntry->pTruth + *(long *)(pFilename_local + 0x2170));
    }
    if (fUnsynthRL_local != 0) {
      pTEntry = (Ses_TruthEntry_t *)((long)pTEntry->pTruth + *(long *)(pFilename_local + 0x21c0));
    }
    if (i != 0) {
      pTEntry = (Ses_TruthEntry_t *)((long)pTEntry->pTruth + *(long *)(pFilename_local + 0x2080));
    }
    if (iStack_28 != 0) {
      pTEntry = (Ses_TruthEntry_t *)((long)pTEntry->pTruth + *(long *)(pFilename_local + 0x20d0));
    }
    fwrite(&pTEntry,8,1,__s);
    for (nEntries._4_4_ = 0; nEntries._4_4_ < 0x400; nEntries._4_4_ = nEntries._4_4_ + 1) {
      if (*(long *)(pFilename_local + (long)nEntries._4_4_ * 8 + 0x18) != 0) {
        for (pTiEntry = *(Ses_TimesEntry_t **)(pFilename_local + (long)nEntries._4_4_ * 8 + 0x18);
            pTiEntry != (Ses_TimesEntry_t *)0x0; pTiEntry = pTiEntry->next) {
          pFile = (FILE *)pTiEntry->pNetwork;
          while (pFile != (FILE *)0x0) {
            if (((fUnsynthImp_local == 0) && (pFile->_IO_write_end != (char *)0x0)) &&
               (*(int *)&pFile->_IO_write_base == 0)) {
              pFile = (FILE *)pFile->_IO_write_ptr;
            }
            else if (((fUnsynthRL_local == 0) && (pFile->_IO_write_end != (char *)0x0)) &&
                    (*(int *)&pFile->_IO_write_base != 0)) {
              pFile = (FILE *)pFile->_IO_write_ptr;
            }
            else if (((i == 0) && (pFile->_IO_write_end == (char *)0x0)) &&
                    (*(int *)&pFile->_IO_write_base == 0)) {
              pFile = (FILE *)pFile->_IO_write_ptr;
            }
            else if (((iStack_28 == 0) && (pFile->_IO_write_end == (char *)0x0)) &&
                    (*(int *)&pFile->_IO_write_base != 0)) {
              pFile = (FILE *)pFile->_IO_write_ptr;
            }
            else {
              fwrite(pTiEntry,8,4,__s);
              fwrite(&pTiEntry->fResLimit,4,1,__s);
              fwrite(pFile,4,8,__s);
              fwrite(&pFile->_IO_write_base,4,1,__s);
              if (pFile->_IO_write_end == (char *)0x0) {
                fwrite((void *)((long)&nEntries + 3),1,1,__s);
                fwrite((void *)((long)&nEntries + 3),1,1,__s);
                fwrite((void *)((long)&nEntries + 3),1,1,__s);
              }
              else {
                fwrite(pFile->_IO_write_end,1,
                       (long)(pFile->_IO_write_end[2] * 4 + 5 + (int)*pFile->_IO_write_end),__s);
              }
              pFile = (FILE *)pFile->_IO_write_ptr;
            }
          }
        }
      }
    }
    fclose(__s);
  }
  return;
}

Assistant:

static void Ses_StoreWrite( Ses_Store_t * pStore, const char * pFilename, int fSynthImp, int fSynthRL, int fUnsynthImp, int fUnsynthRL )
{
    int i;
    char zero = '\0';
    unsigned long nEntries = 0;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;
    FILE * pFile;

    pFile = fopen( pFilename, "wb" );
    if (pFile == NULL)
    {
        printf( "cannot open file \"%s\" for writing\n", pFilename );
        return;
    }

    if ( fSynthImp )   nEntries += pStore->nSynthesizedImp;
    if ( fSynthRL )    nEntries += pStore->nSynthesizedRL;
    if ( fUnsynthImp ) nEntries += pStore->nUnsynthesizedImp;
    if ( fUnsynthRL )  nEntries += pStore->nUnsynthesizedRL;
    fwrite( &nEntries, sizeof( unsigned long ), 1, pFile );

    for ( i = 0; i < SES_STORE_TABLE_SIZE; ++i )
        if ( pStore->pEntries[i] )
        {
            pTEntry = pStore->pEntries[i];

            while ( pTEntry )
            {
                pTiEntry = pTEntry->head;
                while ( pTiEntry )
                {
                    if ( !fSynthImp && pTiEntry->pNetwork && !pTiEntry->fResLimit )    { pTiEntry = pTiEntry->next; continue; }
                    if ( !fSynthRL && pTiEntry->pNetwork && pTiEntry->fResLimit )      { pTiEntry = pTiEntry->next; continue; }
                    if ( !fUnsynthImp && !pTiEntry->pNetwork && !pTiEntry->fResLimit ) { pTiEntry = pTiEntry->next; continue; }
                    if ( !fUnsynthRL && !pTiEntry->pNetwork && pTiEntry->fResLimit )   { pTiEntry = pTiEntry->next; continue; }

                    fwrite( pTEntry->pTruth, sizeof( word ), 4, pFile );
                    fwrite( &pTEntry->nVars, sizeof( int ), 1, pFile );
                    fwrite( pTiEntry->pArrTimeProfile, sizeof( int ), 8, pFile );
                    fwrite( &pTiEntry->fResLimit, sizeof( int ), 1, pFile );

                    if ( pTiEntry->pNetwork )
                    {
                        fwrite( pTiEntry->pNetwork, sizeof( char ), 3 + 4 * pTiEntry->pNetwork[ABC_EXACT_SOL_NGATES] + 2 + pTiEntry->pNetwork[ABC_EXACT_SOL_NVARS], pFile );
                    }
                    else
                    {
                        fwrite( &zero, sizeof( char ), 1, pFile );
                        fwrite( &zero, sizeof( char ), 1, pFile );
                        fwrite( &zero, sizeof( char ), 1, pFile );
                    }

                    pTiEntry = pTiEntry->next;
                }
                pTEntry = pTEntry->next;
            }
        }


    fclose( pFile );
}